

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idmap.cpp
# Opt level: O0

shared_ptr<mbc::Val::ValBase> __thiscall Idmap::get(Idmap *this,string *name)

{
  size_type sVar1;
  mapped_type *pmVar2;
  undefined8 *puVar3;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mbc::Val::ValBase> sVar4;
  string *name_local;
  Idmap *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
                   *)name,in_RDX);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
                           *)name,in_RDX);
    std::shared_ptr<mbc::Val::ValBase>::shared_ptr((shared_ptr<mbc::Val::ValBase> *)this,pmVar2);
    sVar4.super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mbc::Val::ValBase>)
           sVar4.super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Error! the idmap do not have the variable";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

shared_ptr<mbc::Val::ValBase> Idmap::get (string name) {
    if (idmap_.count(name)) {
        return idmap_[name];
    } else {
        throw "Error! the idmap do not have the variable";
    }
}